

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O2

uint32_t WriteBinaryMaterialProperty(aiMaterialProperty *prop)

{
  uint32_t ofs;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  size_t sVar6;
  aiPropertyTypeInfo local_2c;
  
  ofs = WriteMagic(0x123e);
  uVar1 = Write<aiString>(&prop->mKey);
  uVar2 = Write<unsigned_int>(&prop->mSemantic);
  uVar3 = Write<unsigned_int>(&prop->mIndex);
  uVar4 = Write<unsigned_int>(&prop->mDataLength);
  local_2c = prop->mType;
  uVar5 = Write<unsigned_int>(&local_2c);
  sVar6 = fwrite(prop->mData,1,(ulong)prop->mDataLength,(FILE *)out);
  uVar1 = (int)sVar6 + uVar5 + uVar4 + uVar3 + uVar2 + uVar1;
  ChangeInteger(ofs,uVar1);
  return uVar1;
}

Assistant:

uint32_t WriteBinaryMaterialProperty(const aiMaterialProperty* prop)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AIMATERIALPROPERTY);

	len += Write<aiString>(prop->mKey);
	len += Write<unsigned int>(prop->mSemantic);
	len += Write<unsigned int>(prop->mIndex);

	len += Write<unsigned int>(prop->mDataLength);
	len += Write<unsigned int>((unsigned int)prop->mType);
	len += static_cast<uint32_t>(fwrite(prop->mData,1,prop->mDataLength,out));

	ChangeInteger(old,len);
	return len;
}